

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
* __thiscall
embree::CoronaLoader::loadInstances
          (pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
           *__return_storage_ptr__,CoronaLoader *this,Ref<embree::XML> *xml)

{
  string *__lhs;
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  pointer pRVar5;
  XML *pXVar6;
  undefined8 uVar7;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  *ppVar8;
  bool bVar9;
  OBJMaterial *this_00;
  runtime_error *prVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  char *this_01;
  undefined8 ptr;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  Ref<embree::SceneGraph::MaterialNode> material;
  ulong local_160;
  Ref<embree::XML> child;
  string local_150;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  *local_130;
  Ref<embree::XML> *local_128;
  CoronaLoader *local_120;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_120 = this;
  bVar9 = std::operator!=(&xml->ptr->name,"instance");
  if (bVar9) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_150,&xml->ptr->loc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_118.field_1,&local_150,": invalid instance node");
    std::runtime_error::runtime_error(prVar10,(string *)&local_118.field_1);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
  std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_118.field_1);
  local_130 = __return_storage_ptr__;
  OBJMaterial::OBJMaterial(this_00,&local_90);
  material.ptr = (MaterialNode *)this_00;
  (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  std::__cxx11::string::~string((string *)&local_90);
  local_150.field_2._8_8_ = (void *)0x0;
  local_150._M_string_length = 0;
  local_150.field_2._M_allocated_capacity = 0;
  ptr = (void *)0x0;
  local_160 = 0;
  uVar13 = 0;
  uVar15 = 0;
  local_128 = xml;
  do {
    ppVar8 = local_130;
    pRVar5 = (xml->ptr->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(xml->ptr->children).
                      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 3) <= uVar13) {
      std::
      pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
      ::
      pair<embree::Ref<embree::SceneGraph::MaterialNode>_&,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_&,_true>
                (local_130,&material,
                 (vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>
                  *)&local_150);
      alignedFree((void *)local_150.field_2._8_8_);
      if (material.ptr != (MaterialNode *)0x0) {
        (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      return ppVar8;
    }
    pXVar6 = pRVar5[uVar13].ptr;
    child.ptr = pXVar6;
    if (pXVar6 != (XML *)0x0) {
      (*(pXVar6->super_RefCount)._vptr_RefCount[2])(pXVar6);
    }
    __lhs = &pXVar6->name;
    bVar9 = std::operator==(__lhs,"material");
    if (bVar9) {
      loadMaterial((CoronaLoader *)&local_118.field_1,(Ref<embree::XML> *)local_120);
      if (material.ptr != (MaterialNode *)0x0) {
        (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      material.ptr = (MaterialNode *)CONCAT44(local_118.m128[1],local_118.m128[0]);
      uVar14 = uVar15;
    }
    else {
      this_01 = "transform";
      bVar9 = std::operator==(__lhs,"transform");
      if (!bVar9) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_70,&pXVar6->loc);
        std::operator+(&local_50,&local_70,": unknown node: ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_118.field_1,&local_50,__lhs);
        std::runtime_error::runtime_error(prVar10,(string *)&local_118.field_1);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                ((AffineSpace3fa *)&local_118.field_1,(CoronaLoader *)this_01,&child);
      uVar14 = uVar15 + 1;
      uVar17 = local_118.m128[0];
      uVar18 = local_118.m128[1];
      uVar19 = local_118.m128[2];
      uVar20 = local_118.m128[3];
      uVar21 = local_108;
      uVar22 = uStack_104;
      uVar23 = uStack_100;
      uVar24 = uStack_fc;
      uVar25 = local_f8;
      uVar26 = uStack_f4;
      uVar27 = uStack_f0;
      uVar28 = uStack_ec;
      uVar29 = local_e8;
      uVar30 = uStack_e4;
      uVar31 = uStack_e0;
      uVar32 = uStack_dc;
      if (local_160 < uVar14) {
        uVar12 = local_160;
        uVar16 = uVar14;
        if (local_160 != 0) {
          for (; uVar16 = uVar12, uVar12 < uVar14; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
          }
        }
        if (local_160 != uVar16) {
          local_d8 = local_e8;
          uStack_d4 = uStack_e4;
          uStack_d0 = uStack_e0;
          uStack_cc = uStack_dc;
          local_c8 = local_f8;
          uStack_c4 = uStack_f4;
          uStack_c0 = uStack_f0;
          uStack_bc = uStack_ec;
          local_b8 = local_108;
          uStack_b4 = uStack_104;
          uStack_b0 = uStack_100;
          uStack_ac = uStack_fc;
          local_a8 = local_118.m128[0];
          fStack_a4 = local_118.m128[1];
          fStack_a0 = local_118.m128[2];
          fStack_9c = local_118.m128[3];
          local_150.field_2._8_8_ = alignedMalloc(uVar16 << 6,0x10);
          lVar11 = 0x30;
          for (uVar12 = 0; uVar12 < uVar15; uVar12 = uVar12 + 1) {
            puVar2 = (undefined8 *)(ptr + lVar11 + -0x30);
            uVar7 = puVar2[1];
            puVar3 = (undefined8 *)(local_150.field_2._8_8_ + lVar11 + -0x30);
            *puVar3 = *puVar2;
            puVar3[1] = uVar7;
            puVar2 = (undefined8 *)(ptr + lVar11 + -0x20);
            uVar7 = puVar2[1];
            puVar3 = (undefined8 *)(local_150.field_2._8_8_ + lVar11 + -0x20);
            *puVar3 = *puVar2;
            puVar3[1] = uVar7;
            puVar2 = (undefined8 *)(ptr + lVar11 + -0x10);
            uVar7 = puVar2[1];
            puVar3 = (undefined8 *)(local_150.field_2._8_8_ + lVar11 + -0x10);
            *puVar3 = *puVar2;
            puVar3[1] = uVar7;
            uVar7 = ((undefined8 *)(ptr + lVar11))[1];
            *(undefined8 *)(local_150.field_2._8_8_ + lVar11) = *(undefined8 *)(ptr + lVar11);
            ((undefined8 *)(local_150.field_2._8_8_ + lVar11))[1] = uVar7;
            lVar11 = lVar11 + 0x40;
          }
          alignedFree((void *)ptr);
          ptr = local_150.field_2._8_8_;
          uVar17 = local_a8;
          uVar18 = fStack_a4;
          uVar19 = fStack_a0;
          uVar20 = fStack_9c;
          uVar21 = local_b8;
          uVar22 = uStack_b4;
          uVar23 = uStack_b0;
          uVar24 = uStack_ac;
          uVar25 = local_c8;
          uVar26 = uStack_c4;
          uVar27 = uStack_c0;
          uVar28 = uStack_bc;
          uVar29 = local_d8;
          uVar30 = uStack_d4;
          uVar31 = uStack_d0;
          uVar32 = uStack_cc;
          local_160 = uVar16;
          local_150.field_2._M_allocated_capacity = uVar16;
        }
      }
      lVar11 = uVar15 * 0x40;
      pfVar1 = (float *)(ptr + lVar11);
      *pfVar1 = (float)uVar17;
      pfVar1[1] = (float)uVar18;
      pfVar1[2] = (float)uVar19;
      pfVar1[3] = (float)uVar20;
      puVar4 = (undefined4 *)(ptr + lVar11 + 0x10);
      *puVar4 = uVar21;
      puVar4[1] = uVar22;
      puVar4[2] = uVar23;
      puVar4[3] = uVar24;
      puVar4 = (undefined4 *)(ptr + lVar11 + 0x20);
      *puVar4 = uVar25;
      puVar4[1] = uVar26;
      puVar4[2] = uVar27;
      puVar4[3] = uVar28;
      puVar4 = (undefined4 *)(ptr + lVar11 + 0x30);
      *puVar4 = uVar29;
      puVar4[1] = uVar30;
      puVar4[2] = uVar31;
      puVar4[3] = uVar32;
      xml = local_128;
      local_150._M_string_length = uVar14;
    }
    if (pXVar6 != (XML *)0x0) {
      (*(pXVar6->super_RefCount)._vptr_RefCount[3])(pXVar6);
    }
    uVar13 = uVar13 + 1;
    uVar15 = uVar14;
  } while( true );
}

Assistant:

std::pair<Ref<SceneGraph::MaterialNode>, avector<AffineSpace3fa> > CoronaLoader::loadInstances(const Ref<XML>& xml) 
  {
    if (xml->name != "instance") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid instance node");

    /* create default material */
    Ref<SceneGraph::MaterialNode> material = new OBJMaterial;

    avector<AffineSpace3fa> xfms;
    for (size_t i=0; i<xml->children.size(); i++)
    {
      Ref<XML> child = xml->children[i];
      if      (child->name == "material" ) material = loadMaterial(child);
      else if (child->name == "transform") xfms.push_back(load<AffineSpace3fa>(child));
      else THROW_RUNTIME_ERROR(child->loc.str()+": unknown node: "+child->name);
    }

    return std::make_pair(material,xfms);
  }